

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

LogicalExpr __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnBool
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,bool value)

{
  byte bVar1;
  LogicalConstant LVar2;
  byte in_SIL;
  ExprBase in_RDI;
  undefined8 in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  bVar1 = in_SIL & 1;
  LVar2 = BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                    ((BasicExprFactory<std::allocator<char>_> *)
                     (CONCAT17(in_SIL,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff),
                     SUB81((ulong)in_stack_ffffffffffffffe0 >> 0x38,0));
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(bVar1,in_stack_ffffffffffffffe8),(LogicalConstant)in_RDI.impl_,
             LVar2.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_.
             _4_4_);
  return (LogicalExpr)(ExprBase)local_8;
}

Assistant:

LogicalExpr OnBool(bool value) {
    return builder_.MakeLogicalConstant(value);
  }